

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Level.cpp
# Opt level: O0

string * __thiscall
Level::get_level_name_abi_cxx11_(string *__return_storage_ptr__,Level *this,int level_id)

{
  string local_40;
  undefined1 local_1d;
  int local_1c;
  Level *pLStack_18;
  int level_id_local;
  Level *this_local;
  string *ans;
  
  local_1d = 0;
  local_1c = level_id;
  pLStack_18 = this;
  this_local = (Level *)__return_storage_ptr__;
  std::__cxx11::to_string(&local_40,level_id);
  std::operator+(__return_storage_ptr__,"DATA\\",&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string Level::get_level_name(int level_id) {
    std::string ans="DATA\\"+to_string(level_id);
    return ans;
}